

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

attr_list cod_ev_get_stone_attrs(cod_exec_context ec,char *stone_name)

{
  int *piVar1;
  int iVar2;
  long *plVar3;
  stone_type p_Var4;
  char *in_RSI;
  undefined8 in_RDI;
  char *this_stone_name;
  stone_type stone;
  int cur_stone;
  attr_list ret_list;
  event_path_data evp;
  CManager cm;
  ev_state_data *ev_state;
  event_path_data in_stack_ffffffffffffffb8;
  int local_34;
  attr_list local_30;
  
  plVar3 = (long *)cod_get_client_data(in_RDI,0x34567890);
  piVar1 = *(int **)(*plVar3 + 0x118);
  local_30 = (attr_list)0x0;
  if (cod_ev_get_stone_attrs::STONE_NAME_ATOM == -1) {
    cod_ev_get_stone_attrs::STONE_NAME_ATOM = attr_atom_from_string("EVP_STONE_NAME");
  }
  for (local_34 = piVar1[1]; local_34 < *piVar1 + piVar1[1]; local_34 = local_34 + 1) {
    p_Var4 = stone_struct(in_stack_ffffffffffffffb8,0);
    if ((p_Var4 != (stone_type)0x0) && (p_Var4->stone_attrs != (attr_list)0x0)) {
      in_stack_ffffffffffffffb8 = (event_path_data)0x0;
      iVar2 = get_string_attr(p_Var4->stone_attrs,cod_ev_get_stone_attrs::STONE_NAME_ATOM,
                              &stack0xffffffffffffffb8);
      if ((iVar2 != 0) &&
         ((in_RSI != (char *)0x0 &&
          (iVar2 = strcmp((char *)in_stack_ffffffffffffffb8,in_RSI), iVar2 == 0)))) {
        if (local_30 != (attr_list)0x0) {
          printf("Warning, duplicate stone name \"%s\" found during attr query\n",in_RSI);
        }
        local_30 = p_Var4->stone_attrs;
      }
    }
  }
  return local_30;
}

Assistant:

static attr_list cod_ev_get_stone_attrs(cod_exec_context ec, char *stone_name) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    CManager cm = ev_state->cm;
    event_path_data evp = cm->evp;
    attr_list ret_list = NULL;
    int cur_stone;
    static atom_t STONE_NAME_ATOM = -1;
    if (STONE_NAME_ATOM == -1) {
	STONE_NAME_ATOM = attr_atom_from_string("EVP_STONE_NAME");
    }
    for (cur_stone = evp->stone_base_num; cur_stone < evp->stone_count + evp->stone_base_num; ++cur_stone) {
	stone_type stone = stone_struct(evp, cur_stone);
	if (stone && (stone->stone_attrs != NULL)) {
	    char *this_stone_name = NULL;
	    if (get_string_attr(stone->stone_attrs, STONE_NAME_ATOM, &this_stone_name)) {
		if (stone_name && (strcmp(this_stone_name, stone_name) == 0)) {
		    if (ret_list) printf("Warning, duplicate stone name \"%s\" found during attr query\n", stone_name);
		    ret_list = stone->stone_attrs;
		}
	    }
	}
    }
    return ret_list;
}